

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::time_internal::cctz::FixedOffsetToAbbr_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  long lVar1;
  char *pcVar2;
  size_t prefix_len;
  seconds *offset_local;
  string *abbr;
  
  FixedOffsetToName_abi_cxx11_(__return_storage_ptr__,this,offset);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0x12) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,6);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if ((*pcVar2 == '0') &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
       *pcVar2 == '0')) {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,5);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      if ((*pcVar2 == '0') &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
         *pcVar2 == '0')) {
        std::__cxx11::string::erase((ulong)__return_storage_ptr__,3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToAbbr(const seconds& offset) {
  std::string abbr = FixedOffsetToName(offset);
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  if (abbr.size() == prefix_len + 9) {         // <prefix>+99:99:99
    abbr.erase(0, prefix_len);                 // +99:99:99
    abbr.erase(6, 1);                          // +99:9999
    abbr.erase(3, 1);                          // +999999
    if (abbr[5] == '0' && abbr[6] == '0') {    // +999900
      abbr.erase(5, 2);                        // +9999
      if (abbr[3] == '0' && abbr[4] == '0') {  // +9900
        abbr.erase(3, 2);                      // +99
      }
    }
  }
  return abbr;
}